

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

int ED25519_sign(uint8_t *out_sig,uint8_t *message,size_t message_len,uint8_t *private_key)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  ushort local_268;
  byte local_266;
  undefined2 uStack_265;
  undefined1 uStack_263;
  undefined1 uStack_262;
  undefined1 local_261;
  undefined2 uStack_260;
  undefined1 uStack_25e;
  undefined2 uStack_25d;
  undefined1 local_25b;
  undefined1 uStack_25a;
  undefined1 local_259;
  undefined2 uStack_258;
  undefined1 uStack_256;
  undefined2 uStack_255;
  ushort local_253;
  byte local_251;
  undefined2 uStack_250;
  undefined1 uStack_24e;
  undefined1 uStack_24d;
  undefined1 local_24c;
  undefined2 uStack_24b;
  byte bStack_249;
  undefined1 local_248 [32];
  uint8_t hram [64];
  uint8_t nonce [64];
  ge_p3 R;
  SHA512_CTX hash_ctx;
  
  SHA512(private_key,0x20,(uchar *)&local_268);
  local_268 = local_268 & 0xfff8;
  bStack_249 = bStack_249 & 0x3f | 0x40;
  SHA512_Init((SHA512_CTX *)&hash_ctx);
  SHA512_Update((SHA512_CTX *)&hash_ctx,local_248,0x20);
  SHA512_Update((SHA512_CTX *)&hash_ctx,message,message_len);
  SHA512_Final(nonce,(SHA512_CTX *)&hash_ctx);
  x25519_sc_reduce(nonce);
  x25519_ge_scalarmult_base(&R,nonce);
  ge_p3_tobytes(out_sig,&R);
  SHA512_Init((SHA512_CTX *)&hash_ctx);
  SHA512_Update((SHA512_CTX *)&hash_ctx,out_sig,0x20);
  SHA512_Update((SHA512_CTX *)&hash_ctx,private_key + 0x20,0x20);
  SHA512_Update((SHA512_CTX *)&hash_ctx,message,message_len);
  SHA512_Final(hram,(SHA512_CTX *)&hash_ctx);
  x25519_sc_reduce(hram);
  uVar56 = (ulong)((hram[2] & 0x1f) << 0x10) | (ulong)(ushort)hram._0_2_;
  uVar11 = (ulong)((hram[0x17] & 0x1f) << 0x10) | (ulong)(ushort)hram._21_2_;
  uVar29 = (ulong)((local_266 & 0x1f) << 0x10) | (ulong)local_268;
  uVar12 = (ulong)((local_251 & 0x1f) << 0x10) | (ulong)local_253;
  lVar33 = uVar29 * uVar56 + ((ulong)((nonce[2] & 0x1f) << 0x10) | (ulong)(ushort)nonce._0_2_);
  uVar42 = (ulong)(CONCAT13(hram[5],CONCAT21(hram._3_2_,hram[2])) >> 5 & 0x1fffff);
  uVar10 = (ulong)(CONCAT13(uStack_263,CONCAT21(uStack_265,local_266)) >> 5 & 0x1fffff);
  uVar8 = (ulong)((uint3)(CONCAT12(local_261,CONCAT11(uStack_262,uStack_263)) >> 2) & 0x1fffff);
  uVar46 = (ulong)((uint3)(CONCAT12(hram[7],CONCAT11(hram[6],hram[5])) >> 2) & 0x1fffff);
  lVar36 = uVar29 * uVar46 + uVar10 * uVar42 +
           uVar8 * uVar56 +
           (ulong)((uint3)(CONCAT12(nonce[7],CONCAT11(nonce[6],nonce[5])) >> 2) & 0x1fffff);
  uVar17 = (ulong)(CONCAT13(hram[10],CONCAT21(hram._8_2_,hram[7])) >> 7 & 0x1fffff);
  uVar37 = (ulong)(CONCAT13(uStack_25e,CONCAT21(uStack_260,local_261)) >> 7 & 0x1fffff);
  uVar51 = (ulong)(CONCAT13(hram[0xd],CONCAT21(hram._11_2_,hram[10])) >> 4 & 0x1fffff);
  uVar47 = (ulong)(CONCAT13(local_25b,CONCAT21(uStack_25d,uStack_25e)) >> 4 & 0x1fffff);
  lVar30 = uVar29 * uVar51 + uVar10 * uVar17 + uVar37 * uVar42 + uVar56 * uVar47 +
           uVar8 * uVar46 +
           (ulong)(CONCAT13(nonce[0xd],CONCAT21(nonce._11_2_,nonce[10])) >> 4 & 0x1fffff);
  uVar53 = (ulong)((uint3)(CONCAT12(local_259,CONCAT11(uStack_25a,local_25b)) >> 1) & 0x1fffff);
  uVar45 = (ulong)((uint3)(CONCAT12(hram[0xf],CONCAT11(hram[0xe],hram[0xd])) >> 1) & 0x1fffff);
  uVar21 = (ulong)(CONCAT13(uStack_256,CONCAT21(uStack_258,local_259)) >> 6 & 0x1fffff);
  uVar38 = (ulong)(CONCAT13(hram[0x12],CONCAT21(hram._16_2_,hram[0xf])) >> 6 & 0x1fffff);
  lVar31 = uVar29 * uVar38 + uVar37 * uVar17 + uVar45 * uVar10 + uVar8 * uVar51 + uVar46 * uVar47 +
           uVar53 * uVar42 + uVar56 * uVar21 +
           (ulong)(CONCAT13(nonce[0x12],CONCAT21(nonce._16_2_,nonce[0xf])) >> 6 & 0x1fffff);
  uVar9 = (ulong)(uint3)(CONCAT21(uStack_255,uStack_256) >> 3);
  uVar35 = (ulong)(uint3)(CONCAT21(hram._19_2_,hram[0x12]) >> 3);
  lVar32 = uVar29 * uVar11 + uVar35 * uVar10 + uVar45 * uVar37 + uVar8 * uVar38 + uVar47 * uVar51 +
           uVar53 * uVar17 + uVar46 * uVar21 + uVar9 * uVar42 +
           uVar12 * uVar56 + (ulong)(ushort)nonce._21_2_ + (ulong)((nonce[0x17] & 0x1f) << 0x10);
  uVar13 = (ulong)(CONCAT13(uStack_24e,CONCAT21(uStack_250,local_251)) >> 5 & 0x1fffff);
  uVar34 = (ulong)(CONCAT13(hram[0x1a],CONCAT21(hram._24_2_,hram[0x17])) >> 5 & 0x1fffff);
  uVar50 = (ulong)((uint3)(CONCAT12(local_24c,CONCAT11(uStack_24d,uStack_24e)) >> 2) & 0x1fffff);
  uVar39 = (ulong)((uint3)(CONCAT12(hram[0x1c],CONCAT11(hram[0x1b],hram[0x1a])) >> 2) & 0x1fffff);
  lVar14 = uVar29 * uVar39 + uVar10 * uVar34 + uVar35 * uVar37 + uVar8 * uVar11 + uVar47 * uVar38 +
           uVar53 * uVar45 + uVar21 * uVar51 + uVar9 * uVar17 +
           uVar12 * uVar46 + uVar13 * uVar42 + uVar50 * uVar56 +
           (ulong)((uint3)(CONCAT12(nonce[0x1c],CONCAT11(nonce[0x1b],nonce[0x1a])) >> 2) & 0x1fffff)
  ;
  uVar15 = (ulong)(CONCAT13(bStack_249,CONCAT21(uStack_24b,local_24c)) >> 7);
  uVar43 = (ulong)((uint)hram._28_4_ >> 7);
  lVar24 = uVar10 * uVar43 + uVar37 * uVar34 + uVar11 * uVar47 + uVar8 * uVar39 +
           uVar53 * uVar35 + uVar21 * uVar38 + uVar9 * uVar45 + uVar13 * uVar17 + uVar12 * uVar51 +
           uVar50 * uVar46 + uVar42 * uVar15;
  lVar54 = uVar37 * uVar43 + uVar11 * uVar21 + uVar39 * uVar47 + uVar53 * uVar34 + uVar9 * uVar35 +
           uVar12 * uVar38 + uVar45 * uVar13 + uVar17 * uVar15 + uVar50 * uVar51;
  lVar55 = uVar53 * uVar43 + uVar39 * uVar21 + uVar9 * uVar34 + uVar35 * uVar13 + uVar12 * uVar11 +
           uVar50 * uVar38 + uVar45 * uVar15;
  lVar16 = uVar9 * uVar43 + uVar13 * uVar34 + uVar12 * uVar39 + uVar50 * uVar11 + uVar35 * uVar15;
  lVar22 = uVar13 * uVar43 + uVar34 * uVar15 + uVar50 * uVar39;
  uVar18 = lVar33 + 0x100000;
  lVar48 = (uVar18 >> 0x15) +
           uVar29 * uVar42 + uVar56 * uVar10 +
           (ulong)(CONCAT13(nonce[5],CONCAT21(nonce._3_2_,nonce[2])) >> 5 & 0x1fffff);
  uVar26 = lVar36 + 0x100000;
  lVar57 = (uVar26 >> 0x15) +
           uVar29 * uVar17 + uVar56 * uVar37 + uVar46 * uVar10 +
           uVar8 * uVar42 +
           (ulong)(CONCAT13(nonce[10],CONCAT21(nonce._8_2_,nonce[7])) >> 7 & 0x1fffff);
  uVar27 = lVar30 + 0x100000;
  lVar19 = (uVar27 >> 0x15) +
           uVar29 * uVar45 + uVar10 * uVar51 + uVar46 * uVar37 + uVar47 * uVar42 +
           uVar8 * uVar17 + uVar53 * uVar56 +
           (ulong)((uint3)(CONCAT12(nonce[0xf],CONCAT11(nonce[0xe],nonce[0xd])) >> 1) & 0x1fffff);
  uVar1 = lVar31 + 0x100000;
  lVar2 = (uVar1 >> 0x15) +
          uVar29 * uVar35 + uVar10 * uVar38 + uVar37 * uVar51 + uVar47 * uVar17 +
          uVar8 * uVar45 + uVar21 * uVar42 +
          uVar53 * uVar46 + uVar9 * uVar56 + (ulong)(uint3)(CONCAT21(nonce._19_2_,nonce[0x12]) >> 3)
  ;
  uVar3 = lVar32 + 0x100000;
  lVar4 = (uVar3 >> 0x15) +
          uVar29 * uVar34 + uVar11 * uVar10 + uVar37 * uVar38 + uVar8 * uVar35 + uVar45 * uVar47 +
          uVar53 * uVar51 + uVar21 * uVar17 + uVar9 * uVar46 +
          uVar12 * uVar42 + uVar56 * uVar13 +
          (ulong)(CONCAT13(nonce[0x1a],CONCAT21(nonce._24_2_,nonce[0x17])) >> 5 & 0x1fffff);
  uVar5 = lVar14 + 0x100000;
  lVar6 = (uVar5 >> 0x15) +
          uVar29 * uVar43 + uVar11 * uVar37 + uVar39 * uVar10 + uVar8 * uVar34 + uVar35 * uVar47 +
          uVar53 * uVar38 + uVar45 * uVar21 + uVar9 * uVar51 +
          uVar12 * uVar17 + uVar46 * uVar13 + uVar56 * uVar15 + uVar50 * uVar42 +
          (ulong)((uint)nonce._28_4_ >> 7);
  uVar29 = lVar24 + 0x100000;
  lVar7 = (uVar29 >> 0x15) +
          uVar8 * uVar43 + uVar35 * uVar21 + uVar39 * uVar37 + uVar47 * uVar34 +
          uVar53 * uVar11 + uVar9 * uVar38 + uVar13 * uVar51 +
          uVar12 * uVar45 + uVar46 * uVar15 + uVar50 * uVar17;
  uVar8 = lVar54 + 0x100000;
  lVar20 = (uVar8 >> 0x15) +
           uVar47 * uVar43 + uVar21 * uVar34 + uVar9 * uVar11 + uVar53 * uVar39 +
           uVar12 * uVar35 + uVar13 * uVar38 + uVar51 * uVar15 + uVar50 * uVar45;
  uVar10 = lVar55 + 0x100000;
  lVar40 = (uVar10 >> 0x15) +
           uVar21 * uVar43 + uVar11 * uVar13 + uVar9 * uVar39 +
           uVar12 * uVar34 + uVar38 * uVar15 + uVar50 * uVar35;
  uVar9 = lVar16 + 0x100000;
  lVar23 = (uVar9 >> 0x15) + uVar12 * uVar43 + uVar11 * uVar15 + uVar39 * uVar13 + uVar50 * uVar34;
  uVar35 = lVar22 + 0x100000;
  lVar25 = (uVar35 >> 0x15) + uVar50 * uVar43 + uVar39 * uVar15;
  uVar17 = uVar15 * uVar43 + 0x100000;
  uVar45 = lVar48 + 0x100000;
  uVar21 = lVar57 + 0x100000;
  uVar50 = lVar40 + 0x100000;
  lVar49 = (uVar50 >> 0x15) + (lVar16 - (uVar9 & 0xffffffffffe00000));
  uVar9 = lVar23 + 0x100000;
  lVar41 = (uVar9 >> 0x15) + (lVar22 - (uVar35 & 0xffffffffffe00000));
  lVar23 = lVar23 - (uVar9 & 0xffffffffffe00000);
  uVar9 = lVar25 + 0x100000;
  lVar22 = (uVar9 >> 0x15) + (uVar15 * uVar43 - (uVar17 & 0xffffffffffe00000));
  lVar25 = lVar25 - (uVar9 & 0xffffffffffe00000);
  uVar17 = uVar17 >> 0x15;
  uVar12 = lVar20 + 0x100000;
  lVar55 = ((uVar17 * -0xa6f7d + lVar55) - (uVar10 & 0xffffffffffe00000)) + (uVar12 >> 0x15);
  uVar11 = lVar7 + 0x100000;
  lVar44 = ((uVar17 * -0xf39ad + lVar54) - (uVar8 & 0xffffffffffe00000)) + (uVar11 >> 0x15) +
           lVar22 * 0x215d1 + lVar25 * -0xa6f7d;
  uVar8 = lVar6 + 0x100000;
  lVar16 = ((uVar17 * 0x72d18 + lVar24) - (uVar29 & 0xffffffffffe00000)) + lVar22 * 0x9fb67 +
           lVar25 * -0xf39ad + lVar23 * -0xa6f7d + lVar41 * 0x215d1 + (uVar8 >> 0x15);
  uVar29 = lVar19 + 0x100000;
  lVar52 = ((lVar49 * 0xa2c13 + lVar31) - (uVar1 & 0xffffffffffe00000)) + (uVar29 >> 0x15);
  uVar10 = lVar2 + 0x100000;
  lVar24 = ((uVar10 >> 0x15) + lVar32 + lVar49 * 0x9fb67 + lVar23 * 0x72d18 + lVar41 * 0xa2c13) -
           (uVar3 & 0xffffffffffe00000);
  uVar9 = lVar4 + 0x100000;
  lVar31 = (lVar49 * 0x215d1 + (uVar9 >> 0x15) +
            lVar23 * -0xf39ad + lVar41 * 0x9fb67 + lVar25 * 0x72d18 + lVar22 * 0xa2c13 + lVar14) -
           (uVar5 & 0xffffffffffe00000);
  uVar35 = lVar52 + 0x100000;
  lVar54 = ((lVar23 * 0xa2c13 + lVar2 + lVar49 * 0x72d18) - (uVar10 & 0xffffffffffe00000)) +
           ((long)uVar35 >> 0x15);
  uVar3 = lVar24 + 0x100000;
  lVar32 = ((lVar49 * -0xf39ad + lVar4 + lVar23 * 0x9fb67 + lVar41 * 0x72d18 + lVar25 * 0xa2c13) -
           (uVar9 & 0xffffffffffe00000)) + ((long)uVar3 >> 0x15);
  uVar10 = lVar31 + 0x100000;
  lVar14 = ((lVar49 * -0xa6f7d + lVar6 +
            lVar23 * 0x215d1 + lVar41 * -0xf39ad +
            lVar25 * 0x9fb67 + lVar22 * 0x72d18 + uVar17 * 0xa2c13) - (uVar8 & 0xffffffffffe00000))
           + ((long)uVar10 >> 0x15);
  uVar9 = lVar16 + 0x100000;
  lVar41 = ((uVar17 * 0x9fb67 + lVar7) - (uVar11 & 0xffffffffffe00000)) + lVar22 * -0xf39ad +
           lVar25 * 0x215d1 + lVar41 * -0xa6f7d + ((long)uVar9 >> 0x15);
  uVar1 = lVar44 + 0x100000;
  lVar25 = ((uVar17 * 0x215d1 + lVar20) - (uVar12 & 0xffffffffffe00000)) + lVar22 * -0xa6f7d +
           ((long)uVar1 >> 0x15);
  uVar17 = lVar55 + 0x100000;
  lVar4 = ((long)uVar17 >> 0x15) + (lVar40 - (uVar50 & 0xffffffffffe00000));
  uVar50 = lVar14 + 0x100000;
  lVar40 = ((long)uVar50 >> 0x15) + (lVar16 - (uVar9 & 0xffffffffffe00000));
  uVar9 = lVar41 + 0x100000;
  lVar44 = ((long)uVar9 >> 0x15) + (lVar44 - (uVar1 & 0xffffffffffe00000));
  lVar41 = lVar41 - (uVar9 & 0xffffffffffe00000);
  uVar9 = lVar25 + 0x100000;
  lVar55 = ((long)uVar9 >> 0x15) + (lVar55 - (uVar17 & 0xffffffffffe00000));
  lVar25 = lVar25 - (uVar9 & 0xffffffffffe00000);
  uVar9 = lVar32 + 0x100000;
  lVar6 = (lVar4 * -0xa6f7d + lVar31 + ((long)uVar9 >> 0x15)) - (uVar10 & 0xffffffffffe00000);
  uVar10 = lVar54 + 0x100000;
  lVar20 = (lVar4 * -0xf39ad + lVar24 + lVar55 * 0x215d1 +
           lVar25 * -0xa6f7d + ((long)uVar10 >> 0x15)) - (uVar3 & 0xffffffffffe00000);
  lVar22 = ((lVar4 * 0x72d18 + lVar52) - (uVar35 & 0xffffffffffe00000)) + lVar55 * 0x9fb67 +
           lVar25 * -0xf39ad + lVar44 * 0x215d1 + lVar41 * -0xa6f7d;
  lVar7 = lVar40 * 0xa2c13 + (lVar33 - (uVar18 & 0xffffffffffe00000));
  lVar24 = (((uVar45 >> 0x15) + lVar36) - (uVar26 & 0xffffffffffe00000)) + lVar44 * 0xa2c13 +
           lVar41 * 0x72d18 + lVar40 * 0x9fb67;
  lVar23 = lVar40 * 0x215d1 +
           lVar41 * -0xf39ad +
           lVar44 * 0x9fb67 +
           lVar25 * 0x72d18 +
           lVar55 * 0xa2c13 + (uVar21 >> 0x15) + (lVar30 - (uVar27 & 0xffffffffffe00000));
  uVar18 = lVar7 + 0x100000;
  lVar16 = ((long)uVar18 >> 0x15) +
           lVar40 * 0x72d18 + lVar41 * 0xa2c13 + (lVar48 - (uVar45 & 0xffffffffffe00000));
  uVar1 = lVar24 + 0x100000;
  lVar2 = ((long)uVar1 >> 0x15) +
          lVar40 * -0xf39ad +
          lVar41 * 0x9fb67 +
          lVar44 * 0x72d18 + lVar25 * 0xa2c13 + (lVar57 - (uVar21 & 0xffffffffffe00000));
  uVar26 = lVar23 + 0x100000;
  lVar19 = ((lVar4 * 0xa2c13 + lVar19) - (uVar29 & 0xffffffffffe00000)) + lVar55 * 0x72d18 +
           lVar25 * 0x9fb67 + lVar44 * -0xf39ad + lVar41 * 0x215d1 + lVar40 * -0xa6f7d +
           ((long)uVar26 >> 0x15);
  uVar27 = lVar22 + 0x100000;
  lVar25 = ((lVar4 * 0x9fb67 + lVar54 + lVar55 * -0xf39ad + lVar25 * 0x215d1) -
           (uVar10 & 0xffffffffffe00000)) + lVar44 * -0xa6f7d + ((long)uVar27 >> 0x15);
  uVar10 = lVar20 + 0x100000;
  lVar30 = ((lVar4 * 0x215d1 + lVar32 + lVar55 * -0xa6f7d) - (uVar9 & 0xffffffffffe00000)) +
           ((long)uVar10 >> 0x15);
  uVar9 = lVar6 + 0x100000;
  lVar14 = ((long)uVar9 >> 0x15) + (lVar14 - (uVar50 & 0xffffffffffe00000));
  uVar35 = lVar19 + 0x100000;
  uVar17 = lVar25 + 0x100000;
  uVar45 = lVar30 + 0x100000;
  uVar21 = lVar16 + 0x100000;
  uVar50 = lVar2 + 0x100000;
  uVar8 = lVar14 + 0x100000;
  lVar4 = (long)uVar8 >> 0x15;
  uVar3 = lVar4 * 0xa2c13 + (lVar7 - (uVar18 & 0xffffffffffe00000));
  uVar5 = ((lVar4 * 0x72d18 + lVar16) - (uVar21 & 0xffffffffffe00000)) + ((long)uVar3 >> 0x15);
  uVar11 = ((lVar4 * 0x9fb67 + lVar24) - (uVar1 & 0xffffffffffe00000)) + ((long)uVar21 >> 0x15) +
           ((long)uVar5 >> 0x15);
  uVar21 = ((lVar4 * -0xf39ad + lVar2) - (uVar50 & 0xffffffffffe00000)) + ((long)uVar11 >> 0x15);
  uVar26 = ((lVar4 * 0x215d1 + lVar23) - (uVar26 & 0xffffffffffe00000)) + ((long)uVar50 >> 0x15) +
           ((long)uVar21 >> 0x15);
  uVar50 = ((lVar4 * -0xa6f7d + lVar19) - (uVar35 & 0xffffffffffe00000)) + ((long)uVar26 >> 0x15);
  uVar35 = ((long)uVar50 >> 0x15) +
           ((long)uVar35 >> 0x15) + (lVar22 - (uVar27 & 0xffffffffffe00000));
  uVar1 = ((long)uVar35 >> 0x15) + (lVar25 - (uVar17 & 0xffffffffffe00000));
  uVar29 = ((long)uVar1 >> 0x15) + ((long)uVar17 >> 0x15) + (lVar20 - (uVar10 & 0xffffffffffe00000))
  ;
  uVar12 = ((long)uVar29 >> 0x15) + (lVar30 - (uVar45 & 0xffffffffffe00000));
  uVar18 = (lVar6 - (uVar9 & 0xffffffffffe00000)) + ((long)uVar45 >> 0x15) + ((long)uVar12 >> 0x15);
  lVar6 = ((long)uVar18 >> 0x15) + (lVar14 - (uVar8 & 0xffffffffffe00000));
  lVar4 = lVar6 >> 0x15;
  lVar2 = lVar4 * 0xa2c13 + (uVar3 & 0x1fffff);
  uVar27 = (lVar2 >> 0x15) + lVar4 * 0x72d18 + (uVar5 & 0x1fffff);
  uVar3 = ((long)uVar27 >> 0x15) + lVar4 * 0x9fb67 + (uVar11 & 0x1fffff);
  uVar21 = ((long)uVar3 >> 0x15) + lVar4 * -0xf39ad + (uVar21 & 0x1fffff);
  uVar45 = ((long)uVar21 >> 0x15) + lVar4 * 0x215d1 + (uVar26 & 0x1fffff);
  uVar17 = ((long)uVar45 >> 0x15) + lVar4 * -0xa6f7d + (uVar50 & 0x1fffff);
  uVar9 = ((long)uVar17 >> 0x15) + (uVar35 & 0x1fffff);
  uVar10 = ((long)uVar9 >> 0x15) + (uVar1 & 0x1fffff);
  lVar4 = ((long)uVar10 >> 0x15) + (uVar29 & 0x1fffff);
  uVar26 = (lVar4 >> 0x15) + (uVar12 & 0x1fffff);
  uVar18 = ((long)uVar26 >> 0x15) + (uVar18 & 0x1fffff);
  uVar28 = (int)(uVar18 >> 0x15) + ((uint)lVar6 & 0x1fffff);
  out_sig[0x20] = (uint8_t)lVar2;
  out_sig[0x21] = (uint8_t)((ulong)lVar2 >> 8);
  out_sig[0x22] = (byte)((uint)uVar27 << 5) | (byte)((ulong)lVar2 >> 0x10) & 0x1f;
  out_sig[0x23] = (uint8_t)(uVar27 >> 3);
  out_sig[0x24] = (uint8_t)(uVar27 >> 0xb);
  out_sig[0x25] = ((byte)((uint)uVar27 >> 0x13) & 3) + (char)uVar3 * '\x04';
  out_sig[0x26] = (uint8_t)(uVar3 >> 6);
  out_sig[0x27] = (byte)((uint)uVar21 << 7) | (byte)((uint)uVar3 >> 0xe) & 0x7f;
  out_sig[0x28] = (uint8_t)(uVar21 >> 1);
  out_sig[0x29] = (uint8_t)(uVar21 >> 9);
  out_sig[0x2a] = (byte)((uint)uVar45 << 4) | (byte)((uint)uVar21 >> 0x11) & 0xf;
  out_sig[0x2b] = (uint8_t)(uVar45 >> 4);
  out_sig[0x2c] = (uint8_t)(uVar45 >> 0xc);
  out_sig[0x2d] = ((byte)((uint)uVar45 >> 0x14) & 1) + (char)uVar17 * '\x02';
  out_sig[0x2e] = (uint8_t)(uVar17 >> 7);
  out_sig[0x2f] = (byte)((uint)uVar9 << 6) | (byte)((uint)uVar17 >> 0xf) & 0x3f;
  out_sig[0x30] = (uint8_t)(uVar9 >> 2);
  out_sig[0x31] = (uint8_t)(uVar9 >> 10);
  out_sig[0x32] = ((byte)((uint)uVar9 >> 0x12) & 7) + (char)uVar10 * '\b';
  out_sig[0x33] = (uint8_t)(uVar10 >> 5);
  out_sig[0x34] = (uint8_t)((uint)uVar10 >> 0xd);
  out_sig[0x35] = (uint8_t)lVar4;
  out_sig[0x36] = (uint8_t)((ulong)lVar4 >> 8);
  out_sig[0x37] = (byte)((uint)uVar26 << 5) | (byte)((ulong)lVar4 >> 0x10) & 0x1f;
  out_sig[0x38] = (uint8_t)(uVar26 >> 3);
  out_sig[0x39] = (uint8_t)(uVar26 >> 0xb);
  out_sig[0x3a] = ((byte)((uint)uVar26 >> 0x13) & 3) + (char)uVar18 * '\x04';
  out_sig[0x3b] = (uint8_t)(uVar18 >> 6);
  out_sig[0x3c] = (char)uVar28 * -0x80 | (byte)((uint)uVar18 >> 0xe) & 0x7f;
  out_sig[0x3d] = (uint8_t)(uVar28 >> 1);
  out_sig[0x3e] = (uint8_t)(uVar28 >> 9);
  out_sig[0x3f] = (uint8_t)(uVar28 >> 0x11);
  return 1;
}

Assistant:

int ED25519_sign(uint8_t out_sig[64], const uint8_t *message,
                 size_t message_len, const uint8_t private_key[64]) {
  // NOTE: The documentation on this function says that it returns zero on
  // allocation failure. While that can't happen with the current
  // implementation, we want to reserve the ability to allocate in this
  // implementation in the future.

  uint8_t az[SHA512_DIGEST_LENGTH];
  SHA512(private_key, 32, az);

  az[0] &= 248;
  az[31] &= 63;
  az[31] |= 64;

  SHA512_CTX hash_ctx;
  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, az + 32, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t nonce[SHA512_DIGEST_LENGTH];
  SHA512_Final(nonce, &hash_ctx);

  x25519_sc_reduce(nonce);
  ge_p3 R;
  x25519_ge_scalarmult_base(&R, nonce);
  ge_p3_tobytes(out_sig, &R);

  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, out_sig, 32);
  SHA512_Update(&hash_ctx, private_key + 32, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t hram[SHA512_DIGEST_LENGTH];
  SHA512_Final(hram, &hash_ctx);

  x25519_sc_reduce(hram);
  sc_muladd(out_sig + 32, hram, az, nonce);

  // The signature is computed from the private key, but is public.
  CONSTTIME_DECLASSIFY(out_sig, 64);
  return 1;
}